

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FFont::Preload(FFont *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uStack_28;
  int foo;
  
  uVar1 = this->FirstChar;
  uVar3 = (ulong)(uint)this->LastChar;
  if (uVar1 != this->LastChar) {
    uVar4 = 0x21;
    if (0x21 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    uStack_28 = uVar3;
    while( true ) {
      iVar2 = (int)uVar3;
      if (0x7d < iVar2) {
        iVar2 = 0x7e;
      }
      if (iVar2 <= (int)uVar4) break;
      iVar2 = (*this->_vptr_FFont[2])(this,uVar4,&foo);
      if ((FTexture *)CONCAT44(extraout_var,iVar2) != (FTexture *)0x0) {
        FTexture::GetNative((FTexture *)CONCAT44(extraout_var,iVar2),false);
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar3 = (ulong)(uint)this->LastChar;
    }
  }
  return;
}

Assistant:

void FFont::Preload() const
{
	// First and last char are the same? Wait until it's actually needed
	// since nothing is gained by preloading now.
	if (FirstChar == LastChar)
	{
		return;
	}
	for (int i = MAX(FirstChar, 0x21); i < MIN(LastChar, 0x7e); ++i)
	{
		int foo;
		FTexture *pic = GetChar(i, &foo);
		if (pic != NULL)
		{
			pic->GetNative(false);
		}
	}
}